

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::MakeProtoProtoPathRelative
          (CommandLineInterface *this,DiskSourceTree *source_tree,string *proto,
          DescriptorDatabase *fallback_database)

{
  bool bVar1;
  int iVar2;
  DiskFileToVirtualFileResult DVar3;
  char *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  int *piVar7;
  string_view sVar8;
  byte local_241;
  undefined1 local_230 [8];
  string disk_file_1;
  string local_208 [32];
  string local_1e8 [8];
  string error_str;
  undefined1 local_1b8 [8];
  string shadowing_disk_file;
  string virtual_file;
  undefined1 local_160 [8];
  string disk_file;
  undefined1 local_128 [7];
  bool in_fallback_database;
  FileDescriptorProto fallback_file;
  DescriptorDatabase *fallback_database_local;
  string *proto_local;
  DiskSourceTree *source_tree_local;
  CommandLineInterface *this_local;
  
  fallback_file.field_0._224_8_ = fallback_database;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_128);
  local_241 = 0;
  if (fallback_file.field_0._224_8_ != 0) {
    local_241 = (**(code **)(*(long *)fallback_file.field_0._224_8_ + 0x10))
                          (fallback_file.field_0._224_8_,proto,local_128);
  }
  local_241 = local_241 & 1;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = access(pcVar4,0);
  if (iVar2 < 0) {
    std::__cxx11::string::string((string *)local_160);
    sVar8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)proto);
    bVar1 = DiskSourceTree::VirtualFileToDiskFile(source_tree,sVar8,(string *)local_160);
    if ((bVar1) || (local_241 != 0)) {
      this_local._7_1_ = true;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Could not make proto path relative: ");
      poVar5 = std::operator<<(poVar5,(string *)proto);
      poVar5 = std::operator<<(poVar5,": ");
      pcVar4 = strerror(2);
      poVar5 = std::operator<<(poVar5,pcVar4);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    std::__cxx11::string::~string((string *)local_160);
  }
  else {
    std::__cxx11::string::string((string *)(shadowing_disk_file.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_1b8);
    sVar8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)proto);
    error_str.field_2._8_8_ = sVar8._M_len;
    DVar3 = DiskSourceTree::DiskFileToVirtualFile
                      (source_tree,sVar8,(string *)(shadowing_disk_file.field_2._M_local_buf + 8),
                       (string *)local_1b8);
    switch(DVar3) {
    case SUCCESS:
      std::__cxx11::string::operator=
                ((string *)proto,(string *)(shadowing_disk_file.field_2._M_local_buf + 8));
    default:
      this_local._7_1_ = true;
      break;
    case SHADOWED:
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)proto);
      poVar5 = std::operator<<(poVar5,": Input is shadowed in the --proto_path by \"");
      poVar5 = std::operator<<(poVar5,(string *)local_1b8);
      poVar5 = std::operator<<(poVar5,
                               "\".  Either use the latter file as your input or reorder the --proto_path so that the former file\'s location comes first."
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
      break;
    case CANNOT_OPEN:
      if (local_241 == 0) {
        disk_file_1.field_2._M_local_buf[0xe] = '\0';
        (*(source_tree->super_SourceTree)._vptr_SourceTree[3])(local_208);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          (*(source_tree->super_SourceTree)._vptr_SourceTree[3])(local_1e8);
        }
        else {
          piVar7 = __errno_location();
          pcVar4 = strerror(*piVar7);
          std::allocator<char>::allocator();
          disk_file_1.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    (local_1e8,pcVar4,(allocator<char> *)(disk_file_1.field_2._M_local_buf + 0xf));
        }
        if ((disk_file_1.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)(disk_file_1.field_2._M_local_buf + 0xf));
        }
        std::__cxx11::string::~string(local_208);
        poVar5 = std::operator<<((ostream *)&std::cerr,"Could not map to virtual file: ");
        poVar5 = std::operator<<(poVar5,(string *)proto);
        poVar5 = std::operator<<(poVar5,": ");
        poVar5 = std::operator<<(poVar5,local_1e8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
        std::__cxx11::string::~string(local_1e8);
      }
      else {
        this_local._7_1_ = true;
      }
      break;
    case NO_MAPPING:
      std::__cxx11::string::string((string *)local_230);
      sVar8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)proto)
      ;
      bVar1 = DiskSourceTree::VirtualFileToDiskFile(source_tree,sVar8,(string *)local_230);
      if ((bVar1) || (local_241 != 0)) {
        this_local._7_1_ = true;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)proto);
        poVar5 = std::operator<<(poVar5,
                                 ": File does not reside within any path specified using --proto_path (or -I).  You must specify a --proto_path which encompasses this file.  Note that the proto_path must be an exact prefix of the .proto file names -- protoc is too dumb to figure out when two paths (e.g. absolute and relative) are equivalent (it\'s harder than you think)."
                                );
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
      std::__cxx11::string::~string((string *)local_230);
    }
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)(shadowing_disk_file.field_2._M_local_buf + 8));
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_128);
  return this_local._7_1_;
}

Assistant:

bool CommandLineInterface::MakeProtoProtoPathRelative(
    DiskSourceTree* source_tree, std::string* proto,
    DescriptorDatabase* fallback_database) {
  // If it's in the fallback db, don't report non-existent file errors.
  FileDescriptorProto fallback_file;
  bool in_fallback_database =
      fallback_database != nullptr &&
      fallback_database->FindFileByName(*proto, &fallback_file);

  // If the input file path is not a physical file path, it must be a virtual
  // path.
  if (access(proto->c_str(), F_OK) < 0) {
    std::string disk_file;
    if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
        in_fallback_database) {
      return true;
    } else {
      std::cerr << "Could not make proto path relative: " << *proto << ": "
                << strerror(ENOENT) << std::endl;
      return false;
    }
  }

  std::string virtual_file, shadowing_disk_file;
  switch (source_tree->DiskFileToVirtualFile(*proto, &virtual_file,
                                             &shadowing_disk_file)) {
    case DiskSourceTree::SUCCESS:
      *proto = virtual_file;
      break;
    case DiskSourceTree::SHADOWED:
      std::cerr << *proto << ": Input is shadowed in the --proto_path by \""
                << shadowing_disk_file
                << "\".  Either use the latter file as your input or reorder "
                   "the --proto_path so that the former file's location "
                   "comes first."
                << std::endl;
      return false;
    case DiskSourceTree::CANNOT_OPEN: {
      if (in_fallback_database) {
        return true;
      }
      std::string error_str = source_tree->GetLastErrorMessage().empty()
                                  ? strerror(errno)
                                  : source_tree->GetLastErrorMessage();
      std::cerr << "Could not map to virtual file: " << *proto << ": "
                << error_str << std::endl;
      return false;
    }
    case DiskSourceTree::NO_MAPPING: {
      // Try to interpret the path as a virtual path.
      std::string disk_file;
      if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
          in_fallback_database) {
        return true;
      } else {
        // The input file path can't be mapped to any --proto_path and it also
        // can't be interpreted as a virtual path.
        std::cerr
            << *proto
            << ": File does not reside within any path "
               "specified using --proto_path (or -I).  You must specify a "
               "--proto_path which encompasses this file.  Note that the "
               "proto_path must be an exact prefix of the .proto file "
               "names -- protoc is too dumb to figure out when two paths "
               "(e.g. absolute and relative) are equivalent (it's harder "
               "than you think)."
            << std::endl;
        return false;
      }
    }
  }
  return true;
}